

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genData.hpp
# Opt level: O1

pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *
genPlanePair<float>(pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>
                    *__return_storage_ptr__,Matrix<float,_4,_4,_0,_4,_4> *T)

{
  undefined1 auVar1 [16];
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  PointerType ptr;
  long lVar6;
  Index outer;
  Index inner;
  long lVar7;
  EigenBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_> *pEVar8;
  Scalar SVar9;
  float fVar10;
  Matrix<float,_4,_1,_0,_4,_1> Pi;
  FullPivLU<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> lu;
  Matrix<float,_3,_4,_0,_3,_4> nullMatrix;
  scalar_sum_op<float,_float> local_159;
  undefined1 local_158 [16];
  undefined1 local_148 [8];
  undefined8 uStack_140;
  float local_138;
  float fStack_134;
  undefined8 uStack_130;
  undefined8 local_128;
  float fStack_120;
  float fStack_11c;
  undefined8 local_118;
  float fStack_110;
  float fStack_10c;
  DecompositionType *local_108;
  Matrix<float,_4,_4,_1,_4,_4> *local_100;
  DecompositionType *local_f8;
  undefined8 local_f0;
  DecompositionType local_e8;
  redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
  local_70;
  EigenBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_> local_58 [48];
  
  local_e8.m_isInitialized = false;
  local_e8.m_usePrescribedThreshold = false;
  local_e8.m_lu.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (float *)0x0;
  local_e8.m_lu.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0
  ;
  local_e8.m_lu.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0
  ;
  local_e8.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (int *)0x0;
  local_e8.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  local_e8.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (int *)0x0;
  local_e8.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  local_e8.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (int *)0x0;
  local_e8.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  local_e8.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,__1,_1,_1,__1>_>.
  m_storage.m_data = (int *)0x0;
  local_e8.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,__1,_1,_1,__1>_>.
  m_storage.m_cols = 0;
  lVar6 = 0;
  do {
    *(undefined4 *)(local_58 + lVar6) = 0x3f800000;
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x30);
  pEVar8 = local_58;
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      iVar5 = rand();
      *(float *)(pEVar8 + lVar7 * 4) = (((float)iVar5 + (float)iVar5) * 4.656613e-10 + -1.0) * 40.0;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    lVar6 = lVar6 + 1;
    pEVar8 = pEVar8 + 0xc;
  } while (lVar6 != 3);
  Eigen::FullPivLU<Eigen::Matrix<float,-1,-1,0,-1,-1>>::compute<Eigen::Matrix<float,3,4,0,3,4>>
            ((FullPivLU<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&local_e8,local_58);
  if (local_e8.m_isInitialized != false) {
    Eigen::internal::kernel_retval_base<Eigen::FullPivLU<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>_>
    ::kernel_retval_base
              ((kernel_retval_base<Eigen::FullPivLU<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_> *)
               local_148,&local_e8);
    if (((((MatrixType *)local_148)->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
         ).m_storage.m_cols == 4) && (CONCAT44(fStack_134,local_138) == 1)) {
      Eigen::internal::kernel_retval<Eigen::FullPivLU<Eigen::Matrix<float,-1,-1,0,-1,-1>>>::
      evalTo<Eigen::Matrix<float,4,1,0,4,1>>
                ((kernel_retval<Eigen::FullPivLU<Eigen::Matrix<float,_1,_1,0,_1,_1>>> *)local_148,
                 (Matrix<float,_4,_1,_0,_4,_1> *)local_158);
      uStack_140 = 3;
      local_128 = 0;
      local_118 = 4;
      local_148 = (undefined1  [8])local_158;
      uStack_130 = (DecompositionType *)local_158;
      local_70.
      super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
      .
      super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_float>
      .m_d.argImpl.super_evaluator<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>
      .super_block_evaluator<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>
      .m_data = (PointerType)local_158;
      SVar9 = Eigen::internal::
              redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>const>>,3,0>
              ::
              run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>const>>
                        (&local_70,&local_159,
                         (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>
                          *)local_148);
      fVar10 = SQRT(SVar9);
      auVar1._4_4_ = fVar10;
      auVar1._0_4_ = fVar10;
      auVar1._8_4_ = fVar10;
      auVar1._12_4_ = fVar10;
      local_158 = divps(local_158,auVar1);
      local_70.
      super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
      .
      super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_float>
      .m_d._0_8_ = T;
      local_70.
      super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
      .
      super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_float>
      .m_d.argImpl.super_evaluator<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>
      .super_block_evaluator<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>
      .m_data = (PointerType)local_158;
      Eigen::internal::
      Assignment<Eigen::Matrix<float,_4,_4,_1,_4,_4>,_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>,_Eigen::internal::assign_op<float,_float>,_Eigen::internal::Dense2Dense,_void>
      ::run((Matrix<float,_4,_4,_1,_4,_4> *)local_148,(SrcXprType *)&local_70,
            (assign_op<float,_float> *)&local_159);
      local_108 = (DecompositionType *)
                  local_70.
                  super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
                  .
                  super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_float>
                  .m_d.argImpl.
                  super_evaluator<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>.
                  super_block_evaluator<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.
                  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>
                  .m_data;
      local_f8 = (DecompositionType *)
                 local_70.
                 super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
                 .
                 super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_float>
                 .m_d.argImpl.
                 super_evaluator<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>.
                 super_block_evaluator<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.
                 super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>
                 .m_data;
      local_f0._0_4_ = 5.60519e-45;
      local_f0._4_1_ = '\0';
      local_f0._5_1_ = false;
      local_f0._6_1_ = false;
      local_f0._7_1_ = 0;
      local_100 = (Matrix<float,_4,_4,_1,_4,_4> *)local_148;
      if (((ulong)local_70.
                  super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
                  .
                  super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_float>
                  .m_d.argImpl.
                  super_evaluator<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>.
                  super_block_evaluator<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.
                  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>
                  .m_data & 0xf) == 0) {
        fVar10 = *(float *)&(((MatrixType *)
                             local_70.
                             super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
                             .
                             super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_float>
                             .m_d.argImpl.
                             super_evaluator<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>
                             .
                             super_block_evaluator<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false,_true>
                             .
                             super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>
                             .m_data)->
                            super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).
                            m_storage.m_data;
        fVar2 = *(float *)((long)&(((MatrixType *)
                                   local_70.
                                   super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
                                   .
                                   super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_float>
                                   .m_d.argImpl.
                                   super_evaluator<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>
                                   .
                                   super_block_evaluator<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false,_true>
                                   .
                                   super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>
                                   .m_data)->
                                  super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).
                                  m_storage.m_data + 4);
        fVar3 = *(float *)&(((MatrixType *)
                            local_70.
                            super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
                            .
                            super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_float>
                            .m_d.argImpl.
                            super_evaluator<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>
                            .
                            super_block_evaluator<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false,_true>
                            .
                            super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>
                            .m_data)->
                           super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).
                           m_storage.m_rows;
        fVar4 = *(float *)((long)&(((MatrixType *)
                                   local_70.
                                   super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
                                   .
                                   super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_float>
                                   .m_d.argImpl.
                                   super_evaluator<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>
                                   .
                                   super_block_evaluator<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false,_true>
                                   .
                                   super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>
                                   .m_data)->
                                  super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).
                                  m_storage.m_rows + 4);
        *(undefined8 *)
         (__return_storage_ptr__->first).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>
         .m_storage.m_data.array = local_158._0_8_;
        *(undefined8 *)
         ((__return_storage_ptr__->first).
          super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array + 2) =
             local_158._8_8_;
        (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>
        .m_storage.m_data.array[0] =
             uStack_140._4_4_ * fVar4 + (float)local_148._4_4_ * fVar2 +
             (float)uStack_140 * fVar3 + (float)local_148._0_4_ * fVar10;
        (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>
        .m_storage.m_data.array[1] =
             uStack_130._4_4_ * fVar4 + fStack_134 * fVar2 +
             (float)uStack_130 * fVar3 + local_138 * fVar10;
        (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>
        .m_storage.m_data.array[2] =
             fStack_11c * fVar4 + local_128._4_4_ * fVar2 +
             fStack_120 * fVar3 + (float)local_128 * fVar10;
        (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>
        .m_storage.m_data.array[3] =
             fVar4 * fStack_10c + fVar2 * local_118._4_4_ +
             fVar3 * fStack_110 + fVar10 * (float)local_118;
        free(local_e8.m_colsTranspositions.
             super_PlainObjectBase<Eigen::Matrix<int,_1,__1,_1,_1,__1>_>.m_storage.m_data);
        free(local_e8.m_rowsTranspositions.
             super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data);
        free(local_e8.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
             m_storage.m_data);
        free(local_e8.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
             m_storage.m_data);
        free(local_e8.m_lu.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage
             .m_data);
        return __return_storage_ptr__;
      }
      __assert_fail("((internal::UIntPtr(block.data()) % (((int)1 >= (int)evaluator<XprType>::Alignment) ? (int)1 : (int)evaluator<XprType>::Alignment)) == 0) && \"data is not aligned\""
                    ,"/usr/include/eigen3/Eigen/src/Core/CoreEvaluators.h",0x4ca,
                    "Eigen::internal::block_evaluator<const Eigen::Matrix<float, 4, 1>, 4, 1, true>::block_evaluator(const XprType &) [ArgType = const Eigen::Matrix<float, 4, 1>, BlockRows = 4, BlockCols = 1, InnerPanel = true, HasDirectAccess = true]"
                   );
    }
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<float, 4, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<float, 4, 1>]"
                 );
  }
  __assert_fail("m_isInitialized && \"LU is not initialized.\"",
                "/usr/include/eigen3/Eigen/src/LU/FullPivLU.h",0xc0,
                "const internal::kernel_retval<FullPivLU<MatrixType>> Eigen::FullPivLU<Eigen::Matrix<float, -1, -1>>::kernel() const [_MatrixType = Eigen::Matrix<float, -1, -1>]"
               );
}

Assistant:

std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>> 
    genPlanePair(Eigen::Matrix<floatPrec,4,4> T){
    
    Eigen::Matrix<floatPrec, 3, 4> nullMatrix;
    Eigen::FullPivLU<Eigen::Matrix<floatPrec, Eigen::Dynamic, Eigen::Dynamic>> lu;

    // the null space of the matrix built from threee
    // randomly generated 3D points in homogenous coordinates
    nullMatrix = Eigen::Matrix<floatPrec, 3, 4>::Ones(3, 4);
    
    nullMatrix.topLeftCorner(3, 3) =
        Eigen::Matrix<floatPrec, 3, 3>::Random(3, 3) * int(POINTSWITHINCUBE);

    lu.compute(nullMatrix);
    Eigen::Matrix<floatPrec, 4,1> Pi = lu.kernel();
    Pi /= Pi.head(3).norm();

    // requires the pose from the two scans, to compute
    // the coordinates of the plane in RefB
    Eigen::Matrix<floatPrec, 4,1> Nu = T.transpose().inverse() * Pi;

    return std::make_pair(Pi,Nu);
}